

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O1

DFsVariable * __thiscall DFsScript::FindVariable(DFsScript *this,char *name)

{
  DFsVariable *pDVar1;
  DFsScript *pDVar2;
  
  do {
    pDVar1 = VariableForName(this,name);
    if (pDVar1 != (DFsVariable *)0x0) {
      return pDVar1;
    }
    pDVar2 = (this->parent).field_0.p;
    if ((pDVar2 != (DFsScript *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0)) {
      (this->parent).field_0.p = (DFsScript *)0x0;
      pDVar2 = (DFsScript *)0x0;
    }
    this = pDVar2;
  } while (pDVar2 != (DFsScript *)0x0);
  return (DFsVariable *)0x0;
}

Assistant:

DFsVariable *DFsScript::FindVariable(const char *name)
{
	DFsVariable *var;
	DFsScript *current = this;
	
	while(current)
    {
		// check this script
		if ((var = current->VariableForName(name)))
			return var;
		current = current->parent;    // try the parent of this one
    }
	
	return NULL;    // no variable
}